

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string __thiscall crnlib::operator+(crnlib *this,dynamic_string *a,char *p)

{
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar1;
  dynamic_string dVar2;
  dynamic_string local_28;
  
  local_28.m_buf_size = 0;
  local_28.m_len = 0;
  local_28.m_pStr = (char *)0x0;
  dynamic_string::set(&local_28,a,0xffffffff);
  dynamic_string::append(&local_28,p);
  *(undefined4 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  dynamic_string::set((dynamic_string *)this,&local_28,0xffffffff);
  pcVar1 = extraout_RDX;
  if ((local_28.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_28.m_pStr + -8) ^ *(uint *)(local_28.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_28.m_pStr + -0x10);
    pcVar1 = extraout_RDX_00;
  }
  dVar2.m_pStr = pcVar1;
  dVar2._0_8_ = this;
  return dVar2;
}

Assistant:

dynamic_string operator+(const dynamic_string& a, const char* p)
    {
        return dynamic_string(a).append(p);
    }